

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4be406::PpuTest_pre_render_two_sub_cycles_Test::TestBody
          (PpuTest_pre_render_two_sub_cycles_Test *this)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  Type TVar1;
  IPpu *pIVar2;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar3;
  ActionInterface<unsigned_char_(unsigned_short)> *pAVar4;
  uint extraout_var;
  _func_int *message;
  char *in_R9;
  int iVar5;
  InSequence seq;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  InSequence local_a9;
  AssertHelper local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_98 [16];
  _Manager_type local_88;
  MatcherBase<unsigned_short> local_78;
  undefined1 local_60 [8];
  undefined1 local_58 [24];
  PpuRegisters *local_40;
  PpuRegisters *local_38;
  
  (this->super_PpuTest).expected.scanline = 0x105;
  (this->super_PpuTest).expected.cycle = 0x11;
  (this->super_PpuTest).registers.scanline = 0x105;
  (this->super_PpuTest).expected.mask.super_Register<unsigned_char>.value_ = '\b';
  (this->super_PpuTest).registers.mask.super_Register<unsigned_char>.value_ = '\b';
  (this->super_PpuTest).expected.vram_addr.super_Register<unsigned_short>.value_ = 2;
  (this->super_PpuTest).expected.name_table_latch = '\x03';
  (this->super_PpuTest).expected.name_table = '\x02';
  (this->super_PpuTest).expected.pattern_table_shifter_hi = 0x4c80;
  (this->super_PpuTest).expected.pattern_table_latch_low = 0x80;
  (this->super_PpuTest).expected.pattern_table_latch_hi = 0x99;
  (this->super_PpuTest).expected.pattern_table_shifter_low = 0x4000;
  (this->super_PpuTest).expected.attribute_table_shifter_low = 0x7f80;
  (this->super_PpuTest).expected.attribute_table_shifter_hi = 0x7f80;
  (this->super_PpuTest).expected.attribute_table_latch = '\x03';
  pIVar2 = (this->super_PpuTest).ppu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
           super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl;
  (*pIVar2->_vptr_IPpu[3])(pIVar2,0x2005,0);
  pIVar2 = (this->super_PpuTest).ppu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
           super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl;
  (*pIVar2->_vptr_IPpu[3])(pIVar2,0x2005,0);
  testing::InSequence::InSequence(&local_a9);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,0x2000);
  this_00 = &(this->super_PpuTest).mmu;
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x35d,"mmu","read_byte(0x2000)");
  local_a8.data_ = (AssertHelperData *)operator_new(4);
  (local_a8.data_)->type = kFatalFailure;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            (&local_a0,(int *)local_a8.data_);
  pAVar4 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  TVar1 = (local_a8.data_)->type;
  *(Type *)&pAVar4[1]._vptr_ActionInterface = TVar1;
  *(char *)((long)&pAVar4[1]._vptr_ActionInterface + 4) = (char)TVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)local_98,pAVar4);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)local_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)local_58);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_78);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,0x23c0);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x361,"mmu","read_byte(0x23C0)");
  local_a8.data_ = (AssertHelperData *)operator_new(4);
  (local_a8.data_)->type = 0xab;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            (&local_a0,(int *)local_a8.data_);
  pAVar4 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  TVar1 = (local_a8.data_)->type;
  *(Type *)&pAVar4[1]._vptr_ActionInterface = TVar1;
  *(char *)((long)&pAVar4[1]._vptr_ActionInterface + 4) = (char)TVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)local_98,pAVar4);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)local_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)local_58);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_78);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,0x20);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x365,"mmu","read_byte(0x02 * 16u)");
  local_a8.data_ = (AssertHelperData *)operator_new(4);
  (local_a8.data_)->type = 0x80;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            (&local_a0,(int *)local_a8.data_);
  pAVar4 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  TVar1 = (local_a8.data_)->type;
  *(Type *)&pAVar4[1]._vptr_ActionInterface = TVar1;
  *(char *)((long)&pAVar4[1]._vptr_ActionInterface + 4) = (char)TVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)local_98,pAVar4);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)local_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)local_58);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_78);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,0x28);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x368,"mmu","read_byte(0x02 * 16u + 8u)");
  local_a8.data_ = (AssertHelperData *)operator_new(4);
  (local_a8.data_)->type = 0x99;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            (&local_a0,(int *)local_a8.data_);
  pAVar4 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  TVar1 = (local_a8.data_)->type;
  *(Type *)&pAVar4[1]._vptr_ActionInterface = TVar1;
  *(char *)((long)&pAVar4[1]._vptr_ActionInterface + 4) = (char)TVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)local_98,pAVar4);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)local_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)local_58);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_78);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,0x2001);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x36c,"mmu","read_byte(0x2001)");
  local_a8.data_ = (AssertHelperData *)operator_new(4);
  (local_a8.data_)->type = kSkip;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            (&local_a0,(int *)local_a8.data_);
  pAVar4 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  TVar1 = (local_a8.data_)->type;
  *(Type *)&pAVar4[1]._vptr_ActionInterface = TVar1;
  *(char *)((long)&pAVar4[1]._vptr_ActionInterface + 4) = (char)TVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)local_98,pAVar4);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)local_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)local_58);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_78);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,0x23c0);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x370,"mmu","read_byte(0x23C0)");
  local_a8.data_ = (AssertHelperData *)operator_new(4);
  (local_a8.data_)->type = 0xab;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            (&local_a0,(int *)local_a8.data_);
  pAVar4 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  TVar1 = (local_a8.data_)->type;
  *(Type *)&pAVar4[1]._vptr_ActionInterface = TVar1;
  *(char *)((long)&pAVar4[1]._vptr_ActionInterface + 4) = (char)TVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)local_98,pAVar4);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)local_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)local_58);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_78);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,0x30);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x373,"mmu","read_byte(0x03 * 16u)");
  local_a8.data_ = (AssertHelperData *)operator_new(4);
  (local_a8.data_)->type = 0x80;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            (&local_a0,(int *)local_a8.data_);
  pAVar4 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  TVar1 = (local_a8.data_)->type;
  *(Type *)&pAVar4[1]._vptr_ActionInterface = TVar1;
  *(char *)((long)&pAVar4[1]._vptr_ActionInterface + 4) = (char)TVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)local_98,pAVar4);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)local_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)local_58);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_78);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,0x38);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x375,"mmu","read_byte(0x03 * 16u + 8u)");
  local_a8.data_ = (AssertHelperData *)operator_new(4);
  (local_a8.data_)->type = 0x99;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            (&local_a0,(int *)local_a8.data_);
  pAVar4 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar4->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  TVar1 = (local_a8.data_)->type;
  *(Type *)&pAVar4[1]._vptr_ActionInterface = TVar1;
  *(char *)((long)&pAVar4[1]._vptr_ActionInterface + 4) = (char)TVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)local_98,pAVar4);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)local_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
  local_38 = &(this->super_PpuTest).expected;
  local_40 = &(this->super_PpuTest).registers;
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)local_58);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_78);
  testing::InSequence::~InSequence(&local_a9);
  iVar5 = 0x11;
  do {
    (*((this->super_PpuTest).ppu._M_t.
       super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
       super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
       super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl)->_vptr_IPpu[4])();
    local_98[0] = (extraout_var & 0x100) == 0;
    local_98._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_98[0]) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_60,(internal *)local_98,(AssertionResult *)"pixel.has_value()",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                 ,0x37a,(char *)CONCAT71(local_60._1_7_,local_60[0]));
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if ((undefined1 *)CONCAT71(local_60._1_7_,local_60[0]) != local_58 + 8) {
        operator_delete((undefined1 *)CONCAT71(local_60._1_7_,local_60[0]),
                        (ulong)(local_58._8_8_ + 1));
      }
      if (local_78.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
          (_func_int **)0x0) {
        (**(code **)(*local_78.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))
                  ();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_98 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_98._8_8_);
    }
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  testing::internal::CmpHelperEQ<n_e_s::core::PpuRegisters,n_e_s::core::PpuRegisters>
            ((internal *)local_60,"expected","registers",local_38,local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *(_func_int **)local_58._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
               ,0x37d,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)CONCAT71(local_98._1_7_,local_98[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_98._1_7_,local_98[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_
                );
  }
  return;
}

Assistant:

TEST_F(PpuTest, pre_render_two_sub_cycles) {
    registers.scanline = expected.scanline = 261; // Start at pre-render
    registers.mask = expected.mask =
            PpuMask(0b0000'1000); // Enable background rendering

    expected.cycle = 17;
    // Vram should be increased at cycle 8 and 16
    expected.vram_addr = PpuVram(0x0002);
    expected.name_table = 0x02;
    expected.name_table_latch = 0x03;
    expected.pattern_table_shifter_hi = 0x4C80;
    expected.pattern_table_latch_hi = 0x99;
    expected.pattern_table_shifter_low = 0x4000;
    expected.pattern_table_latch_low = 0x80;
    expected.attribute_table_shifter_low = 0x7F80;
    expected.attribute_table_shifter_hi = 0x7F80;
    expected.attribute_table_latch = 0x03;

    // Clear scrolling
    ppu->write_byte(0x2005, 0);
    ppu->write_byte(0x2005, 0);

    {
        testing::InSequence seq;
        // First cycle.
        // Nametable on cycle 1 set to index 2
        EXPECT_CALL(mmu, read_byte(0x2000)).WillOnce(Return(0x02));

        // Attribute on cycle 3.
        // Second tile has the same attribute byte as the first.
        EXPECT_CALL(mmu, read_byte(0x23C0)).WillRepeatedly(Return(0xAB));

        // Pattern table low byte on cycle 5.
        // Each tile uses 16 bytes. So tile with index 2 starts at address 16*2.
        EXPECT_CALL(mmu, read_byte(0x02 * 16u)).WillOnce(Return(0x80));
        // High byte on cycle 7
        // Second bit plane address is 8 bytes after the first bit plane.
        EXPECT_CALL(mmu, read_byte(0x02 * 16u + 8u)).WillOnce(Return(0x99));

        // Second cycle.
        // Nametable on cycle 9 set to index 3
        EXPECT_CALL(mmu, read_byte(0x2001)).WillOnce(Return(0x03));

        // Attribute on cycle 11.
        // Second tile has the same attribute byte as the first.
        EXPECT_CALL(mmu, read_byte(0x23C0)).WillRepeatedly(Return(0xAB));

        // Pattern table low byte on cycle 13.
        EXPECT_CALL(mmu, read_byte(0x03 * 16u)).WillOnce(Return(0x80));
        // Pattern table high byte on cycle 15
        EXPECT_CALL(mmu, read_byte(0x03 * 16u + 8u)).WillOnce(Return(0x99));
    }

    for (int i = 0; i < 17; ++i) {
        const auto pixel = ppu->execute();
        EXPECT_FALSE(pixel.has_value());
    }

    EXPECT_EQ(expected, registers);
}